

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O0

void PrintHeader(int jpre,int gstype)

{
  int in_ESI;
  int in_EDI;
  
  if (in_EDI == 1) {
    printf("\n\nPreconditioner type is           jpre = %s\n","SUN_PREC_LEFT");
  }
  else {
    printf("\n\nPreconditioner type is           jpre = %s\n","SUN_PREC_RIGHT");
  }
  if (in_ESI == 1) {
    printf("\nGram-Schmidt method type is    gstype = %s\n\n\n","SUN_MODIFIED_GS");
  }
  else {
    printf("\nGram-Schmidt method type is    gstype = %s\n\n\n","SUN_CLASSICAL_GS");
  }
  return;
}

Assistant:

static void PrintHeader(int jpre, int gstype)
{
  if (jpre == SUN_PREC_LEFT)
  {
    printf("\n\nPreconditioner type is           jpre = %s\n", "SUN_PREC_LEFT");
  }
  else
  {
    printf("\n\nPreconditioner type is           jpre = %s\n",
           "SUN_PREC_RIGHT");
  }

  if (gstype == SUN_MODIFIED_GS)
  {
    printf("\nGram-Schmidt method type is    gstype = %s\n\n\n",
           "SUN_MODIFIED_GS");
  }
  else
  {
    printf("\nGram-Schmidt method type is    gstype = %s\n\n\n",
           "SUN_CLASSICAL_GS");
  }
}